

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfKeyCode.cpp
# Opt level: O3

void __thiscall Imf_3_4::KeyCode::KeyCode(KeyCode *this,KeyCode *other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = other->_filmType;
  iVar2 = other->_prefix;
  iVar3 = other->_count;
  this->_filmMfcCode = other->_filmMfcCode;
  this->_filmType = iVar1;
  this->_prefix = iVar2;
  this->_count = iVar3;
  iVar1 = other->_perfsPerFrame;
  this->_perfOffset = other->_perfOffset;
  this->_perfsPerFrame = iVar1;
  this->_perfsPerCount = other->_perfsPerCount;
  return;
}

Assistant:

KeyCode::KeyCode (const KeyCode& other)
{
    _filmMfcCode   = other._filmMfcCode;
    _filmType      = other._filmType;
    _prefix        = other._prefix;
    _count         = other._count;
    _perfOffset    = other._perfOffset;
    _perfsPerFrame = other._perfsPerFrame;
    _perfsPerCount = other._perfsPerCount;
}